

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subject_set_register_tests.cpp
# Opt level: O2

void __thiscall
bidfx_public_api::price::pixie::SubjectSetRegisterTest_test_comparator_with_realistic_subjects_Test
::TestBody(SubjectSetRegisterTest_test_comparator_with_realistic_subjects_Test *this)

{
  pointer pSVar1;
  vector<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>
  *rhs;
  pointer pSVar2;
  char *message;
  int iVar3;
  AssertionResult gtest_ar;
  vector<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>
  shuffle_input;
  AssertHelper local_158;
  default_random_engine rng;
  Subject local_148 [24];
  Subject subject;
  SubjectSetRegister subject_register;
  
  std::
  vector<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>
  ::vector(&shuffle_input,
           (vector<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>
            *)RealSubscriptionExample::REAL_SORTED_LIST);
  rng._M_x = 1;
  for (iVar3 = 0; iVar3 != 100; iVar3 = iVar3 + 1) {
    bidfx_public_api::price::pixie::SubjectSetRegister::SubjectSetRegister(&subject_register);
    std::
    shuffle<__gnu_cxx::__normal_iterator<bidfx_public_api::price::subject::Subject*,std::vector<bidfx_public_api::price::subject::Subject,std::allocator<bidfx_public_api::price::subject::Subject>>>,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&>
              ((__normal_iterator<bidfx_public_api::price::subject::Subject_*,_std::vector<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>_>
                )shuffle_input.
                 super__Vector_base<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>
                 ._M_impl.super__Vector_impl_data._M_start,
               (__normal_iterator<bidfx_public_api::price::subject::Subject_*,_std::vector<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>_>
                )shuffle_input.
                 super__Vector_base<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>
                 ._M_impl.super__Vector_impl_data._M_finish,&rng);
    pSVar1 = shuffle_input.
             super__Vector_base<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pSVar2 = shuffle_input.
                  super__Vector_base<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>
                  ._M_impl.super__Vector_impl_data._M_start; pSVar2 != pSVar1;
        pSVar2 = pSVar2 + 0x18) {
      bidfx_public_api::price::subject::Subject::Subject(&subject,pSVar2);
      bidfx_public_api::price::subject::Subject::Subject(local_148,&subject);
      bidfx_public_api::price::pixie::SubjectSetRegister::Register(&subject_register,local_148,0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_148);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&subject);
    }
    bidfx_public_api::price::pixie::SubjectSetRegister::NextSubscriptionSync();
    rhs = (vector<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>
           *)bidfx_public_api::price::pixie::SubscriptionSync::GetSubjects();
    testing::internal::
    CmpHelperEQ<std::vector<bidfx_public_api::price::subject::Subject,std::allocator<bidfx_public_api::price::subject::Subject>>,std::vector<bidfx_public_api::price::subject::Subject,std::allocator<bidfx_public_api::price::subject::Subject>>>
              ((internal *)&gtest_ar,"RealSubscriptionExample::REAL_SORTED_LIST",
               "subject_register.NextSubscriptionSync()->GetSubjects()",
               (vector<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>
                *)RealSubscriptionExample::REAL_SORTED_LIST,rhs);
    std::_Optional_payload_base<bidfx_public_api::price::pixie::SubscriptionSync>::_M_reset
              ((_Optional_payload_base<bidfx_public_api::price::pixie::SubscriptionSync> *)&subject)
    ;
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&subject);
      message = "";
      if (gtest_ar.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_158,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/subject_set_register_tests.cpp"
                 ,0x1de,message);
      testing::internal::AssertHelper::operator=(&local_158,(Message *)&subject);
      testing::internal::AssertHelper::~AssertHelper(&local_158);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&subject);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    SubjectSetRegister::~SubjectSetRegister(&subject_register);
  }
  std::
  vector<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>
  ::~vector(&shuffle_input);
  return;
}

Assistant:

TEST(SubjectSetRegisterTest, test_comparator_with_realistic_subjects)
{
    std::vector<Subject> shuffle_input(RealSubscriptionExample::REAL_SORTED_LIST);
    auto rng = std::default_random_engine {};

    for (int i = 0; i < 100; i++)
    {
        SubjectSetRegister subject_register = SubjectSetRegister();
        std::shuffle(std::begin(shuffle_input), std::end(shuffle_input), rng);

        for (Subject subject : shuffle_input)
        {
            subject_register.Register(std::move(subject), false);
        }

        EXPECT_EQ(RealSubscriptionExample::REAL_SORTED_LIST, subject_register.NextSubscriptionSync()->GetSubjects());
    }
}